

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

uint __thiscall
llvm::DWARFVerifier::verifyDebugNamesCULists(DWARFVerifier *this,DWARFDebugNames *AccelTable)

{
  bool bVar1;
  uint uVar2;
  uint32_t uVar3;
  pointer this_00;
  unsigned_long *puVar4;
  raw_ostream *prVar5;
  pointer pvVar6;
  uint64_t uVar7;
  unit_iterator_range uVar8;
  iterator iVar9;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_unsigned_long_&>_>_>
  local_2b0;
  reference local_260;
  value_type *KV;
  undefined1 local_248 [8];
  iterator __end1_2;
  iterator __begin1_2;
  DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
  *__range1_2;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
  local_218;
  uint64_t local_1a8;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
  local_1a0;
  iterator local_140;
  ConstIterator local_130;
  undefined1 local_120 [8];
  iterator Iter;
  uint64_t Offset;
  uint32_t End;
  uint32_t CU_1;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_> local_f8;
  NameIndex *local_a8;
  NameIndex *NI;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  DWARFDebugNames *__range1_1;
  uint64_t uStack_80;
  uint NumErrors;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *local_78;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *CU;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__end1;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *__begin1;
  unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *local_58;
  iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
  *local_50;
  unit_iterator_range *__range1;
  undefined8 local_38;
  uint64_t NotIndexed;
  DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
  CUMap;
  DWARFDebugNames *AccelTable_local;
  DWARFVerifier *this_local;
  
  CUMap._16_8_ = AccelTable;
  DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
  ::DenseMap((DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
              *)&NotIndexed,0);
  local_38 = 0xffffffffffffffff;
  uVar2 = DWARFContext::getNumCompileUnits(this->DCtx);
  DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
  ::reserve((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
             *)&NotIndexed,uVar2);
  uVar8 = DWARFContext::compile_units(this->DCtx);
  local_58 = uVar8.end_iterator;
  __begin1 = uVar8.begin_iterator;
  local_50 = (iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
              *)&__begin1;
  __end1 = iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>
           ::begin(local_50);
  CU = iterator_range<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_*>::
       end(local_50);
  for (; __end1 != CU; __end1 = __end1 + 1) {
    local_78 = __end1;
    this_00 = std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>::operator->
                        (__end1);
    uStack_80 = DWARFUnit::getOffset(this_00);
    puVar4 = DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
             ::operator[]((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                           *)&NotIndexed,&stack0xffffffffffffff80);
    *puVar4 = 0xffffffffffffffff;
  }
  __range1_1._4_4_ = 0;
  __begin1_1 = (const_iterator)CUMap._16_8_;
  __end1_1 = DWARFDebugNames::begin((DWARFDebugNames *)CUMap._16_8_);
  NI = DWARFDebugNames::end((DWARFDebugNames *)__begin1_1);
  for (; __end1_1 != NI; __end1_1 = __end1_1 + 1) {
    local_a8 = __end1_1;
    uVar3 = DWARFDebugNames::NameIndex::getCUCount(__end1_1);
    if (uVar3 == 0) {
      prVar5 = error(this);
      _End = DWARFDebugNames::NameIndex::getUnitOffset(local_a8);
      formatv<unsigned_long>
                (&local_f8,"Name Index @ {0:x} does not index any CU\n",(unsigned_long *)&End);
      raw_ostream::operator<<(prVar5,&local_f8.super_formatv_object_base);
      formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_>::
      ~formatv_object(&local_f8);
      __range1_1._4_4_ = __range1_1._4_4_ + 1;
    }
    else {
      Offset._4_4_ = 0;
      uVar3 = DWARFDebugNames::NameIndex::getCUCount(local_a8);
      for (; Offset._4_4_ < uVar3; Offset._4_4_ = Offset._4_4_ + 1) {
        Iter.End = (pointer)DWARFDebugNames::NameIndex::getCUOffset(local_a8,Offset._4_4_);
        iVar9 = DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                ::find((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                        *)&NotIndexed,(const_arg_type_t<unsigned_long>)&Iter.End);
        Iter.Ptr = iVar9.End;
        local_120 = (undefined1  [8])iVar9.Ptr;
        iVar9 = DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                ::end((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                       *)&NotIndexed);
        local_140 = iVar9;
        DenseMapIterator<unsigned_long,unsigned_long,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,unsigned_long>,true>
        ::DenseMapIterator<false,void>
                  ((DenseMapIterator<unsigned_long,unsigned_long,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,unsigned_long>,true>
                    *)&local_130,&local_140);
        bVar1 = DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
                ::operator==((DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
                              *)local_120,&local_130);
        if (bVar1) {
          prVar5 = error(this);
          local_1a8 = DWARFDebugNames::NameIndex::getUnitOffset(local_a8);
          formatv<unsigned_long,_unsigned_long_&>
                    (&local_1a0,"Name Index @ {0:x} references a non-existing CU @ {1:x}\n",
                     &local_1a8,(unsigned_long *)&Iter.End);
          raw_ostream::operator<<(prVar5,&local_1a0.super_formatv_object_base);
          formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
          ::~formatv_object(&local_1a0);
          __range1_1._4_4_ = __range1_1._4_4_ + 1;
        }
        else {
          pvVar6 = DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
                   ::operator->((DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
                                 *)local_120);
          if ((pvVar6->super_pair<unsigned_long,_unsigned_long>).second == 0xffffffffffffffff) {
            uVar7 = DWARFDebugNames::NameIndex::getUnitOffset(local_a8);
            pvVar6 = DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
                     ::operator->((DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
                                   *)local_120);
            (pvVar6->super_pair<unsigned_long,_unsigned_long>).second = uVar7;
          }
          else {
            prVar5 = error(this);
            __range1_2 = (DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                          *)DWARFDebugNames::NameIndex::getUnitOffset(local_a8);
            pvVar6 = DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
                     ::operator->((DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
                                   *)local_120);
            formatv<unsigned_long,_unsigned_long_&,_unsigned_long_&>
                      (&local_218,
                       "Name Index @ {0:x} references a CU @ {1:x}, but this CU is already indexed by Name Index @ {2:x}\n"
                       ,(unsigned_long *)&__range1_2,(unsigned_long *)&Iter.End,
                       &(pvVar6->super_pair<unsigned_long,_unsigned_long>).second);
            raw_ostream::operator<<(prVar5,&local_218.super_formatv_object_base);
            formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
            ::~formatv_object(&local_218);
          }
        }
      }
    }
  }
  iVar9 = DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
          ::begin((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                   *)&NotIndexed);
  __end1_2.End = iVar9.Ptr;
  iVar9 = DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
          ::end((DenseMapBase<llvm::DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>,_unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
                 *)&NotIndexed);
  while( true ) {
    __end1_2.Ptr = iVar9.End;
    local_248 = (undefined1  [8])iVar9.Ptr;
    DenseMapIterator<unsigned_long,unsigned_long,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,unsigned_long>,true>
    ::DenseMapIterator<false,void>
              ((DenseMapIterator<unsigned_long,unsigned_long,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseMapPair<unsigned_long,unsigned_long>,true>
                *)&KV,(DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
                       *)local_248);
    bVar1 = DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
            ::operator!=((DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
                          *)&__end1_2.End,(ConstIterator *)&KV);
    uVar2 = __range1_1._4_4_;
    if (!bVar1) break;
    local_260 = DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
                ::operator*((DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
                             *)&__end1_2.End);
    if ((local_260->super_pair<unsigned_long,_unsigned_long>).second == 0xffffffffffffffff) {
      prVar5 = warn(this);
      formatv<const_unsigned_long_&>
                (&local_2b0,"CU @ {0:x} not covered by any Name Index\n",(unsigned_long *)local_260)
      ;
      raw_ostream::operator<<(prVar5,&local_2b0.super_formatv_object_base);
      formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_unsigned_long_&>_>_>::
      ~formatv_object(&local_2b0);
    }
    DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
    ::operator++((DenseMapIterator<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>,_false>
                  *)&__end1_2.End);
    iVar9.End = __end1_2.Ptr;
    iVar9.Ptr = (pointer)local_248;
  }
  DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
  ::~DenseMap((DenseMap<unsigned_long,_unsigned_long,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_unsigned_long>_>
               *)&NotIndexed);
  return uVar2;
}

Assistant:

unsigned
DWARFVerifier::verifyDebugNamesCULists(const DWARFDebugNames &AccelTable) {
  // A map from CU offset to the (first) Name Index offset which claims to index
  // this CU.
  DenseMap<uint64_t, uint64_t> CUMap;
  const uint64_t NotIndexed = std::numeric_limits<uint64_t>::max();

  CUMap.reserve(DCtx.getNumCompileUnits());
  for (const auto &CU : DCtx.compile_units())
    CUMap[CU->getOffset()] = NotIndexed;

  unsigned NumErrors = 0;
  for (const DWARFDebugNames::NameIndex &NI : AccelTable) {
    if (NI.getCUCount() == 0) {
      error() << formatv("Name Index @ {0:x} does not index any CU\n",
                         NI.getUnitOffset());
      ++NumErrors;
      continue;
    }
    for (uint32_t CU = 0, End = NI.getCUCount(); CU < End; ++CU) {
      uint64_t Offset = NI.getCUOffset(CU);
      auto Iter = CUMap.find(Offset);

      if (Iter == CUMap.end()) {
        error() << formatv(
            "Name Index @ {0:x} references a non-existing CU @ {1:x}\n",
            NI.getUnitOffset(), Offset);
        ++NumErrors;
        continue;
      }

      if (Iter->second != NotIndexed) {
        error() << formatv("Name Index @ {0:x} references a CU @ {1:x}, but "
                           "this CU is already indexed by Name Index @ {2:x}\n",
                           NI.getUnitOffset(), Offset, Iter->second);
        continue;
      }
      Iter->second = NI.getUnitOffset();
    }
  }

  for (const auto &KV : CUMap) {
    if (KV.second == NotIndexed)
      warn() << formatv("CU @ {0:x} not covered by any Name Index\n", KV.first);
  }

  return NumErrors;
}